

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O0

void io::uci::parsePosition(string *input,Board *pos)

{
  undefined1 *puVar1;
  char *__s;
  size_t this;
  bool bVar2;
  istream *piVar3;
  undefined1 local_270 [8];
  string moveString;
  istringstream local_230 [8];
  istringstream ss;
  Move local_b0;
  Move move;
  string local_88;
  allocator<char> local_51;
  string local_50;
  long local_30;
  size_t indexMoves;
  size_t indexFen;
  size_t indexStartpos;
  Board *pos_local;
  string *input_local;
  
  indexStartpos = (size_t)pos;
  pos_local = (Board *)input;
  indexFen = std::__cxx11::string::find((char *)input,0x16353a);
  indexMoves = std::__cxx11::string::find((char *)pos_local,0x1686b9);
  local_30 = std::__cxx11::string::find((char *)pos_local,0x1686be);
  this = indexStartpos;
  __s = board::Board::DEFAULT_FEN;
  if (indexFen == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    board::Board::parseFen((Board *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else if (indexMoves != 0xffffffffffffffff) {
    if (local_30 == -1) {
      std::__cxx11::string::substr((ulong)&move,(ulong)pos_local);
      board::Board::parseFen((Board *)this,(string *)&move);
      std::__cxx11::string::~string((string *)&move);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)pos_local);
      board::Board::parseFen((Board *)this,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  if (local_30 != -1) {
    board::Move::Move(&local_b0);
    puVar1 = (undefined1 *)((long)&moveString.field_2 + 8);
    std::__cxx11::string::substr((ulong)puVar1,(ulong)pos_local);
    std::__cxx11::istringstream::istringstream(local_230,puVar1,8);
    std::__cxx11::string::~string((string *)(moveString.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_270);
    while( true ) {
      piVar3 = std::operator>>((istream *)local_230,(string *)local_270);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_b0 = parseMove((string *)local_270,(Board *)indexStartpos);
      board::makemove::move(&local_b0,(Board *)indexStartpos);
    }
    board::Board::resetPly((Board *)indexStartpos);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::istringstream::~istringstream(local_230);
  }
  board::Board::print((Board *)indexStartpos);
  return;
}

Assistant:

void io::uci::parsePosition(const std::string& input, board::Board& pos)
{
    size_t indexStartpos = input.find("startpos");
    size_t indexFen = input.find("fen ");
    size_t indexMoves = input.find("moves ");
    if (indexStartpos == 0) {
        pos.parseFen(board::Board::DEFAULT_FEN);
    }
    else if (indexFen != std::string::npos) {
        if (indexMoves != std::string::npos) {
            pos.parseFen(input.substr(indexFen + 4));
        }
        else {
            pos.parseFen(input.substr(indexFen + 4, indexMoves - 5));
        }
    }
    if (indexMoves != std::string::npos) {
        board::Move move;
        std::istringstream ss(input.substr(indexMoves + 6));
        std::string moveString;
        while (ss >> moveString) {
            move = io::parseMove(moveString, pos);
            board::makemove::move(move, pos);
        }
        pos.resetPly();
    }
    pos.print();
}